

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O1

void __thiscall argo::pointer::pointer(pointer *this,string *pointer)

{
  pointer pcVar1;
  string *in_RAX;
  string *local_18;
  
  (this->m_path).super__List_base<argo::pointer::token,_std::allocator<argo::pointer::token>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  (this->m_path).super__List_base<argo::pointer::token,_std::allocator<argo::pointer::token>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  (this->m_path).super__List_base<argo::pointer::token,_std::allocator<argo::pointer::token>_>.
  _M_impl._M_node._M_size = 0;
  local_18 = in_RAX;
  if (*(pointer->_M_dataplus)._M_p == '#') {
    utf8::json_string_to_utf8((utf8 *)&local_18,pointer);
    build_from_uri_fragment(this,local_18);
  }
  else {
    utf8::json_string_to_utf8((utf8 *)&local_18,pointer);
    build_from_json_string(this,local_18);
  }
  if (local_18 != (string *)0x0) {
    pcVar1 = (local_18->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &local_18->field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(local_18);
  }
  return;
}

Assistant:

pointer::pointer(const std::string &pointer)
{
    // is this a URI fragment type pointer?
    if (pointer[0] == '#')
    {
        build_from_uri_fragment(*utf8::json_string_to_utf8(pointer));
    }
    else
    {
        build_from_json_string(*utf8::json_string_to_utf8(pointer));
    }
}